

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

char * x509v3_bytes_to_hex(uint8_t *in,size_t len)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  uint8_t *ret;
  size_t unused_len;
  CBB cbb;
  
  iVar1 = CBB_init(&cbb,len * 3 + 1);
  if (iVar1 != 0) {
    sVar2 = 0;
    while (len != sVar2) {
      if (((sVar2 != 0) && (iVar1 = CBB_add_u8(&cbb,':'), iVar1 == 0)) ||
         (iVar1 = CBB_add_u8(&cbb,"0123456789ABCDEF"[in[sVar2] >> 4]), iVar1 == 0))
      goto LAB_0019c839;
      iVar1 = CBB_add_u8(&cbb,"0123456789ABCDEF"[in[sVar2] & 0xf]);
      sVar2 = sVar2 + 1;
      if (iVar1 == 0) goto LAB_0019c839;
    }
    iVar1 = CBB_add_u8(&cbb,'\0');
    if ((iVar1 != 0) && (iVar1 = CBB_finish(&cbb,&ret,&unused_len), iVar1 != 0)) {
      return (char *)ret;
    }
  }
LAB_0019c839:
  CBB_cleanup(&cbb);
  return (char *)0x0;
}

Assistant:

char *x509v3_bytes_to_hex(const uint8_t *in, size_t len) {
  CBB cbb;
  if (!CBB_init(&cbb, len * 3 + 1)) {
    goto err;
  }
  for (size_t i = 0; i < len; i++) {
    static const char hex[] = "0123456789ABCDEF";
    if ((i > 0 && !CBB_add_u8(&cbb, ':')) ||
        !CBB_add_u8(&cbb, hex[in[i] >> 4]) ||
        !CBB_add_u8(&cbb, hex[in[i] & 0xf])) {
      goto err;
    }
  }
  uint8_t *ret;
  size_t unused_len;
  if (!CBB_add_u8(&cbb, 0) || !CBB_finish(&cbb, &ret, &unused_len)) {
    goto err;
  }

  return (char *)ret;

err:
  CBB_cleanup(&cbb);
  return NULL;
}